

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

Color ColorFromHSV(float hue,float saturation,float value)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  float extraout_XMM0_Db;
  int iVar11;
  undefined1 extraout_var [12];
  undefined1 auVar8 [16];
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  fVar12 = hue / 60.0;
  fVar5 = fmodf(fVar12 + 5.0,6.0);
  fVar13 = 4.0 - fVar5;
  if (fVar5 <= 4.0 - fVar5) {
    fVar13 = fVar5;
  }
  if (1.0 <= fVar13) {
    fVar13 = 1.0;
  }
  if (fVar13 <= 0.0) {
    fVar13 = 0.0;
  }
  fVar16 = -value * saturation;
  fVar5 = fmodf(fVar12 + 3.0,6.0);
  auVar15._0_4_ = fmodf(fVar12 + 1.0,6.0);
  auVar15._4_12_ = extraout_var;
  auVar9._12_4_ = extraout_var._8_4_;
  auVar9._0_8_ = auVar15._0_8_;
  auVar9._8_4_ = extraout_var._0_4_;
  auVar8._8_8_ = auVar9._8_8_;
  auVar8._4_4_ = fVar5;
  auVar8._0_4_ = auVar15._0_4_;
  auVar10._0_12_ = auVar8._0_12_;
  auVar10._12_4_ = extraout_XMM0_Db;
  auVar14._0_4_ = 4.0 - auVar15._0_4_;
  auVar14._4_4_ = 4.0 - fVar5;
  auVar14._8_4_ = 0.0 - extraout_var._0_4_;
  auVar14._12_4_ = 0.0 - extraout_XMM0_Db;
  auVar15 = minps(auVar14,auVar10);
  auVar15 = minps(auVar15,_DAT_0015d7a0);
  auVar15 = maxps(auVar15,ZEXT816(0));
  iVar6 = (int)((value + fVar16 * auVar15._0_4_) * 255.0);
  iVar11 = (int)((value + fVar16 * auVar15._4_4_) * 255.0);
  sVar1 = (short)iVar6;
  sVar2 = (short)((uint)iVar6 >> 0x10);
  sVar3 = (short)iVar11;
  sVar4 = (short)((uint)iVar11 >> 0x10);
  uVar7 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * (char)((uint)iVar11 >> 0x10) - (0xff < sVar4),
                   CONCAT12((0 < sVar3) * (sVar3 < 0x100) * (char)iVar11 - (0xff < sVar3),
                            CONCAT11((0 < sVar2) * (sVar2 < 0x100) * (char)((uint)iVar6 >> 0x10) -
                                     (0xff < sVar2),
                                     (0 < sVar1) * (sVar1 < 0x100) * (char)iVar6 - (0xff < sVar1))))
  ;
  return (Color)((int)((fVar13 * fVar16 + value) * 255.0) & 0xffU |
                 (uVar7 >> 0x10) << 8 | uVar7 << 0x10 | 0xff000000);
}

Assistant:

Color ColorFromHSV(float hue, float saturation, float value)
{
    Color color = { 0, 0, 0, 255 };

    // Red channel
    float k = fmodf((5.0f + hue/60.0f), 6);
    float t = 4.0f - k;
    k = (t < k)? t : k;
    k = (k < 1)? k : 1;
    k = (k > 0)? k : 0;
    color.r = (unsigned char)((value - value*saturation*k)*255.0f);

    // Green channel
    k = fmodf((3.0f + hue/60.0f), 6);
    t = 4.0f - k;
    k = (t < k)? t : k;
    k = (k < 1)? k : 1;
    k = (k > 0)? k : 0;
    color.g = (unsigned char)((value - value*saturation*k)*255.0f);

    // Blue channel
    k = fmodf((1.0f + hue/60.0f), 6);
    t = 4.0f - k;
    k = (t < k)? t : k;
    k = (k < 1)? k : 1;
    k = (k > 0)? k : 0;
    color.b = (unsigned char)((value - value*saturation*k)*255.0f);

    return color;
}